

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O2

err_t btokCVCWrap(octet *cert,size_t *cert_len,btok_cvc_t *cvc,octet *privkey,size_t privkey_len)

{
  ulong uVar1;
  bool_t bVar2;
  err_t eVar3;
  size_t sVar4;
  octet *poVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  octet *poVar10;
  char *oid;
  octet *poVar11;
  octet *poVar12;
  octet *poVar13;
  size_t local_268;
  der_anchor_t CertHAT [1];
  der_anchor_t PubKey [1];
  der_anchor_t CVCert [1];
  der_anchor_t local_1c8;
  der_anchor_t CVExt [1];
  der_anchor_t CertBody [1];
  
  bVar2 = memIsValid(cvc,0x128);
  if (bVar2 == 0) {
    return 0x6d;
  }
  uVar1 = privkey_len - 0x18 >> 3;
  if (5 < (privkey_len << 0x3d | uVar1)) {
    return 0x6d;
  }
  if ((0x2bUL >> (uVar1 & 0x3f) & 1) == 0) {
    return 0x6d;
  }
  bVar2 = memIsValid(privkey,privkey_len);
  if (bVar2 != 0) {
    if ((cert_len != (size_t *)0x0) && (bVar2 = memIsValid(cert_len,8), bVar2 == 0)) {
      return 0x6d;
    }
    if (cvc->pubkey_len == 0) {
      eVar3 = btokParamsStd((bign_params *)CertBody,privkey_len);
      if (eVar3 != 0) {
        return eVar3;
      }
      poVar5 = cvc->pubkey;
      if (privkey_len == 0x18) {
        eVar3 = bign96PubkeyCalc(poVar5,(bign_params *)CertBody,privkey);
      }
      else {
        eVar3 = bignPubkeyCalc(poVar5,(bign_params *)CertBody,privkey);
      }
      if (eVar3 != 0) {
        return eVar3;
      }
      cvc->pubkey_len = privkey_len * 2;
      memSet(poVar5 + privkey_len * 2,'\0',privkey_len * -2 + 0x80);
    }
    eVar3 = btokCVCCheck(cvc);
    if (eVar3 != 0) {
      return eVar3;
    }
    sVar4 = derTSEQEncStart(CVCert,cert,0,0x7f21);
    poVar5 = cert + sVar4;
    if (cert == (octet *)0x0) {
      poVar5 = (octet *)0x0;
    }
    bVar2 = memIsValid(cvc,0x128);
    local_268 = 0xffffffffffffffff;
    if ((bVar2 != 0) && (bVar2 = btokCVCNameIsValid(cvc->authority), bVar2 != 0)) {
      bVar2 = btokCVCNameIsValid(cvc->holder);
      if (bVar2 != 0) {
        poVar10 = cvc->from;
        bVar2 = tmDateIsValid2(poVar10);
        if (bVar2 != 0) {
          poVar12 = cvc->until;
          bVar2 = tmDateIsValid2(poVar12);
          if ((((bVar2 != 0) && (bVar2 = tmDateLeq2(poVar10,poVar12), bVar2 != 0)) &&
              (uVar1 = cvc->pubkey_len - 0x30 >> 4, (cvc->pubkey_len << 0x3c | uVar1) < 6)) &&
             ((0x2bUL >> (uVar1 & 0x3f) & 1) != 0)) {
            sVar6 = derTSEQEncStart(CertBody,poVar5,0,0x7f4e);
            poVar11 = poVar5 + sVar6;
            if (poVar5 == (octet *)0x0) {
              poVar11 = (octet *)0x0;
            }
            sVar7 = derTSIZEEnc(poVar11,0x5f29,0);
            poVar13 = poVar11 + sVar7;
            if (poVar11 == (octet *)0x0) {
              poVar13 = (octet *)0x0;
            }
            sVar8 = derTPSTREnc(poVar13,0x42,cvc->authority);
            poVar11 = poVar13 + sVar8;
            if (poVar13 == (octet *)0x0) {
              poVar11 = (octet *)0x0;
            }
            sVar8 = sVar7 + sVar6 + sVar8;
            sVar6 = derTSEQEncStart(PubKey,poVar11,sVar8,0x7f49);
            poVar13 = poVar11 + sVar6;
            if (poVar11 == (octet *)0x0) {
              poVar13 = (octet *)0x0;
            }
            sVar7 = derOIDEnc(poVar13,"1.2.112.0.2.0.34.101.45.2.1");
            poVar11 = poVar13 + sVar7;
            if (poVar13 == (octet *)0x0) {
              poVar11 = (octet *)0x0;
            }
            sVar9 = derTBITEnc(poVar11,3,cvc->pubkey,cvc->pubkey_len << 3);
            poVar13 = poVar11 + sVar9;
            if (poVar11 == (octet *)0x0) {
              poVar13 = (octet *)0x0;
            }
            sVar9 = sVar8 + sVar6 + sVar7 + sVar9;
            sVar6 = derTSEQEncStop(poVar13,sVar9,PubKey);
            poVar11 = poVar13 + sVar6;
            if (poVar13 == (octet *)0x0) {
              poVar11 = (octet *)0x0;
            }
            sVar7 = derTPSTREnc(poVar11,0x5f20,cvc->holder);
            poVar13 = poVar11 + sVar7;
            if (poVar11 == (octet *)0x0) {
              poVar13 = (octet *)0x0;
            }
            sVar7 = sVar9 + sVar6 + sVar7;
            bVar2 = memIsZero(cvc->hat_eid,5);
            if (bVar2 == 0) {
              sVar6 = derTSEQEncStart(CertHAT,poVar13,sVar7,0x7f4c);
              poVar11 = poVar13 + sVar6;
              if (poVar13 == (octet *)0x0) {
                poVar11 = (octet *)0x0;
              }
              sVar8 = derOIDEnc(poVar11,"1.2.112.0.2.0.34.101.79.6.1");
              poVar13 = poVar11 + sVar8;
              if (poVar11 == (octet *)0x0) {
                poVar13 = (octet *)0x0;
              }
              sVar9 = derEnc(poVar13,4,cvc->hat_eid,5);
              poVar11 = poVar13 + sVar9;
              if (poVar13 == (octet *)0x0) {
                poVar11 = (octet *)0x0;
              }
              sVar9 = sVar6 + sVar7 + sVar8 + sVar9;
              sVar7 = derTSEQEncStop(poVar11,sVar9,CertHAT);
              poVar13 = poVar11 + sVar7;
              if (poVar11 == (octet *)0x0) {
                poVar13 = (octet *)0x0;
              }
              sVar7 = sVar9 + sVar7;
            }
            sVar6 = derEnc(poVar13,0x5f25,poVar10,6);
            poVar10 = poVar13 + sVar6;
            if (poVar13 == (octet *)0x0) {
              poVar10 = (octet *)0x0;
            }
            sVar8 = derEnc(poVar10,0x5f24,poVar12,6);
            poVar12 = poVar10 + sVar8;
            if (poVar10 == (octet *)0x0) {
              poVar12 = (octet *)0x0;
            }
            sVar8 = sVar7 + sVar6 + sVar8;
            bVar2 = memIsZero(cvc->hat_esign,2);
            if (bVar2 == 0) {
              sVar6 = derTSEQEncStart(CVExt,poVar12,sVar8,0x65);
              poVar10 = poVar12 + sVar6;
              if (poVar12 == (octet *)0x0) {
                poVar10 = (octet *)0x0;
              }
              sVar7 = derTSEQEncStart(&local_1c8,poVar10,sVar6 + sVar8,0x73);
              poVar12 = poVar10 + sVar7;
              if (poVar10 == (octet *)0x0) {
                poVar12 = (octet *)0x0;
              }
              sVar9 = derOIDEnc(poVar12,"1.2.112.0.2.0.34.101.79.8.1");
              poVar10 = poVar12 + sVar9;
              if (poVar12 == (octet *)0x0) {
                poVar10 = (octet *)0x0;
              }
              sVar9 = sVar6 + sVar8 + sVar7 + sVar9;
              sVar6 = derTSEQEncStart(CertHAT,poVar10,sVar9,0x7f4c);
              poVar12 = poVar10 + sVar6;
              if (poVar10 == (octet *)0x0) {
                poVar12 = (octet *)0x0;
              }
              sVar7 = derOIDEnc(poVar12,"1.2.112.0.2.0.34.101.79.6.2");
              poVar10 = poVar12 + sVar7;
              if (poVar12 == (octet *)0x0) {
                poVar10 = (octet *)0x0;
              }
              sVar8 = derEnc(poVar10,4,cvc->hat_esign,2);
              poVar12 = poVar10 + sVar8;
              if (poVar10 == (octet *)0x0) {
                poVar12 = (octet *)0x0;
              }
              sVar8 = sVar9 + sVar6 + sVar7 + sVar8;
              sVar6 = derTSEQEncStop(poVar12,sVar8,CertHAT);
              poVar10 = poVar12 + sVar6;
              if (poVar12 == (octet *)0x0) {
                poVar10 = (octet *)0x0;
              }
              sVar8 = sVar8 + sVar6;
              sVar6 = derTSEQEncStop(poVar10,sVar8,&local_1c8);
              poVar11 = poVar10 + sVar6;
              if (poVar10 == (octet *)0x0) {
                poVar11 = (octet *)0x0;
              }
              sVar8 = sVar8 + sVar6;
              sVar6 = derTSEQEncStop(poVar11,sVar8,CVExt);
              poVar12 = poVar11 + sVar6;
              if (poVar11 == (octet *)0x0) {
                poVar12 = (octet *)0x0;
              }
              sVar8 = sVar8 + sVar6;
            }
            local_268 = derTSEQEncStop(poVar12,sVar8,CertBody);
            local_268 = local_268 + sVar8;
          }
        }
      }
    }
    if (poVar5 != (octet *)0x0) {
      CertHAT[0].der = (octet *)0x10;
      eVar3 = btokParamsStd((bign_params *)CertBody,privkey_len);
      if (eVar3 != 0) {
        return eVar3;
      }
      if (privkey_len < 0x21) {
        sVar6 = beltHash_keep();
      }
      else {
        sVar6 = bashHash_keep();
      }
      poVar10 = (octet *)blobCreate(sVar6 + privkey_len * 2);
      if (poVar10 == (octet *)0x0) {
        return 0x6e;
      }
      poVar11 = poVar10 + privkey_len;
      poVar12 = poVar11 + privkey_len;
      if (privkey_len < 0x21) {
        beltHashStart(poVar12);
        beltHashStepH(poVar5,local_268,poVar12);
        beltHashStepG2(poVar10,privkey_len,poVar12);
        oid = "1.2.112.0.2.0.34.101.31.81";
      }
      else {
        bashHashStart(poVar12,privkey_len * 4);
        bashHashStepH(poVar5,local_268,poVar12);
        bashHashStepG(poVar10,privkey_len,poVar12);
        oid = "1.2.112.0.2.0.34.101.77.13";
        if (privkey_len == 0x30) {
          oid = "1.2.112.0.2.0.34.101.77.12";
        }
      }
      eVar3 = bignOidToDER((octet *)PubKey,(size_t *)CertHAT,oid);
      if (eVar3 == 0) {
        bVar2 = rngIsValid();
        sVar6 = 0;
        if (bVar2 != 0) {
          rngStepR(poVar11,privkey_len,(void *)0x0);
          sVar6 = privkey_len;
        }
        poVar12 = poVar10;
        if (privkey_len == 0x18) {
          eVar3 = bign96Sign2(cvc->sig,(bign_params *)CertBody,(octet *)PubKey,
                              (size_t)CertHAT[0].der,poVar10,privkey,poVar11,sVar6);
        }
        else {
          eVar3 = bignSign2(cvc->sig,(bign_params *)CertBody,(octet *)PubKey,(size_t)CertHAT[0].der,
                            poVar10,privkey,poVar11,sVar6);
        }
      }
      blobClose(poVar12);
      if (eVar3 != 0) {
        return eVar3;
      }
    }
    poVar10 = poVar5 + local_268;
    if (poVar5 == (octet *)0x0) {
      poVar10 = (octet *)0x0;
    }
    sVar6 = 0x22;
    if (privkey_len != 0x18) {
      sVar6 = (privkey_len >> 1) + privkey_len;
    }
    cvc->sig_len = sVar6;
    sVar6 = derEnc(poVar10,0x5f37,cvc->sig,sVar6);
    poVar5 = poVar10 + sVar6;
    if (poVar10 == (octet *)0x0) {
      poVar5 = (octet *)0x0;
    }
    sVar6 = sVar4 + local_268 + sVar6;
    sVar4 = derTSEQEncStop(poVar5,sVar6,CVCert);
    if (cert_len != (size_t *)0x0) {
      *cert_len = sVar6 + sVar4;
    }
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t btokCVCWrap(octet cert[], size_t* cert_len, btok_cvc_t* cvc,
	const octet privkey[], size_t privkey_len)
{
	err_t code;
	der_anchor_t CVCert[1];
	size_t count = 0;
	size_t t;
	// проверить входные данные
	if (!memIsValid(cvc, sizeof(btok_cvc_t)) ||
		privkey_len != 24 && 
			privkey_len != 32 && privkey_len != 48 && privkey_len != 64 ||
		!memIsValid(privkey, privkey_len) ||
		!memIsNullOrValid(cert_len, O_PER_S))
		return ERR_BAD_INPUT;
	// построить открытый ключ
	if (cvc->pubkey_len == 0)
	{
		code = btokPubkeyCalc(cvc->pubkey, privkey, privkey_len);
		ERR_CALL_CHECK(code);
		cvc->pubkey_len = 2 * privkey_len;
		memSetZero(cvc->pubkey + cvc->pubkey_len,
			sizeof(cvc->pubkey) - cvc->pubkey_len);
	}
	// проверить содержимое сертификата
	code = btokCVCCheck(cvc);
	ERR_CALL_CHECK(code);
	// начать кодирование...
	t = derTSEQEncStart(CVCert, cert, count, 0x7F21);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// ...кодировать и подписать основную часть...
	t = btokCVCBodyEnc(cert, cvc);
	ASSERT(t != SIZE_MAX);
	if (cert)
	{
		code = btokSign(cvc->sig, cert, t, privkey, privkey_len);
		ERR_CALL_CHECK(code);
	}
	cert = cert ? cert + t : 0, count += t;
	if (privkey_len == 24)
		cvc->sig_len = 34;
	else
		cvc->sig_len = privkey_len + privkey_len / 2;
	// ...кодировать подпись...
	t = derTOCTEnc(cert, 0x5F37, cvc->sig, cvc->sig_len);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// ...завершить кодирование
	t = derTSEQEncStop(cert, count, CVCert);
	ASSERT(t != SIZE_MAX);
	cert = cert ? cert + t : 0, count += t;
	// возвратить длину DER-кода
	if (cert_len)
		*cert_len = count;
	return ERR_OK;
}